

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

size_t coda_strnspc(char *s,char *n,size_t len)

{
  char *pcVar1;
  char *p;
  char *pcVar2;
  char cVar3;
  
  pcVar1 = s;
  if (0 < (long)len) {
    do {
      if (*n != '\0') {
        pcVar2 = n + 1;
        cVar3 = *n;
        do {
          if (*pcVar1 == cVar3) goto LAB_00105608;
          cVar3 = *pcVar2;
          pcVar2 = pcVar2 + 1;
        } while (cVar3 != '\0');
      }
      pcVar1 = pcVar1 + 1;
    } while (pcVar1 < s + len);
  }
LAB_00105608:
  return (long)pcVar1 - (long)s;
}

Assistant:

size_t coda_strnspc(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) return p - s;
		}
	}

	return p - s;
}